

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<void_(const_int_&)>::PerformDefaultAction
          (FunctionMocker<void_(const_int_&)> *this,ArgumentTuple *args,string *call_description)

{
  bool bVar1;
  OnCallSpec<void_(const_int_&)> *this_00;
  Action<void_(const_int_&)> *this_01;
  runtime_error *this_02;
  undefined1 local_50 [8];
  string message;
  OnCallSpec<void_(const_int_&)> *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<void_(const_int_&)> *this_local;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<void_(const_int_&)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<void>::Exists();
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)local_50);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    DefaultValue<void>::Get();
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    this_01 = OnCallSpec<void_(const_int_&)>::GetAction(this_00);
    std::tuple<const_int_&>::tuple((tuple<const_int_&> *)((long)&message.field_2 + 8),args);
    Action<void_(const_int_&)>::Perform(this_01,(ArgumentTuple *)((long)&message.field_2 + 8));
  }
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }